

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

t_gobj * canvas_findhitbox(_glist *x,int xpos,int ypos,int *x1p,int *y1p,int *x2p,int *y2p)

{
  _selection **pp_Var1;
  int iVar2;
  _selection *p_Var3;
  t_gobj *y;
  t_selection *ptVar4;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *local_48;
  int *local_40;
  int *local_38;
  
  *x1p = -0x7fffffff;
  y = x->gl_list;
  local_40 = y1p;
  local_38 = x2p;
  if (y == (t_gobj *)0x0) {
    local_48 = (t_gobj *)0x0;
  }
  else {
    local_48 = (t_gobj *)0x0;
    do {
      iVar2 = canvas_hitbox(x,y,xpos,ypos,&x1,&y1,&x2,&y2);
      if ((iVar2 != 0) && (*x1p < x1)) {
        *x1p = x1;
        *local_40 = y1;
        *local_38 = x2;
        *y2p = y2;
        local_48 = y;
      }
      y = y->g_next;
    } while (y != (_gobj *)0x0);
  }
  if (((x->gl_editor != (t_editor *)0x0) &&
      (ptVar4 = x->gl_editor->e_selection, ptVar4 != (t_selection *)0x0)) &&
     (p_Var3 = ptVar4, ptVar4->sel_next != (_selection *)0x0)) {
    do {
      if (p_Var3->sel_what == (t_gobj *)0x0) {
        return local_48;
      }
      pp_Var1 = &p_Var3->sel_next;
      p_Var3 = *pp_Var1;
    } while (*pp_Var1 != (_selection *)0x0);
    do {
      iVar2 = canvas_hitbox(x,ptVar4->sel_what,xpos,ypos,&x1,&y1,&x2,&y2);
      if (iVar2 != 0) {
        *x1p = x1;
        *local_40 = y1;
        *local_38 = x2;
        *y2p = y2;
        local_48 = ptVar4->sel_what;
      }
      ptVar4 = ptVar4->sel_next;
    } while (ptVar4 != (_selection *)0x0);
  }
  return local_48;
}

Assistant:

static t_gobj *canvas_findhitbox(t_canvas *x, int xpos, int ypos,
    int *x1p, int *y1p, int *x2p, int *y2p)
{
    t_gobj *y, *rval = 0;
    int x1, y1, x2, y2;
    *x1p = -0x7fffffff;
    for (y = x->gl_list; y; y = y->g_next)
    {
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2)
            && (x1 > *x1p))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2, rval = y;
    }
        /* if there are at least two selected objects, we'd prefer
           to find a selected one (never mind which) to the one we got. */
    if (x->gl_editor && x->gl_editor->e_selection &&
        x->gl_editor->e_selection->sel_next && !glist_isselected(x, y))
    {
        t_selection *sel;
        for (sel = x->gl_editor->e_selection; sel; sel = sel->sel_next)
            if (canvas_hitbox(x, sel->sel_what, xpos, ypos, &x1, &y1, &x2, &y2))
                *x1p = x1, *y1p = y1, *x2p = x2, *y2p = y2,
                    rval = sel->sel_what;
    }
    return (rval);
}